

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

matd_t * matd_inverse(matd_t *x)

{
  matd_t mVar1;
  matd_t mVar2;
  uint uVar3;
  uint uVar4;
  matd_t *pmVar5;
  matd_plu_t *mlu;
  matd_t *pmVar6;
  double dVar7;
  
  if (x == (matd_t *)0x0) {
    __assert_fail("x != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x1e4,"matd_t *matd_inverse(const matd_t *)");
  }
  uVar3 = x->nrows;
  uVar4 = x->ncols;
  if (uVar3 != uVar4) {
    __assert_fail("x->nrows == x->ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x1e5,"matd_t *matd_inverse(const matd_t *)");
  }
  if (uVar3 < 2) {
    mVar1 = x[1];
    if (((double)mVar1 != 0.0) || (NAN((double)mVar1))) {
      pmVar5 = (matd_t *)calloc(1,0x10);
      pmVar5->nrows = 0;
      pmVar5->ncols = 0;
      pmVar5[1] = (matd_t)(1.0 / (double)mVar1);
      return pmVar5;
    }
  }
  else if (uVar3 == 2) {
    mVar1 = x[1];
    mVar2 = x[2];
    dVar7 = (double)x[4] * (double)mVar1 - (double)x[3] * (double)mVar2;
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      dVar7 = 1.0 / dVar7;
      pmVar5 = (matd_t *)calloc(1,0x28);
      pmVar5->nrows = 2;
      pmVar5->ncols = 2;
      pmVar5[1] = (matd_t)((double)x[(ulong)(uVar4 + 1) + 1] * dVar7);
      pmVar5[2] = (matd_t)(-(double)mVar2 * dVar7);
      pmVar5[3] = (matd_t)(-(double)x[(ulong)uVar4 + 1] * dVar7);
      pmVar5[4] = (matd_t)((double)mVar1 * dVar7);
      return pmVar5;
    }
  }
  else {
    if (uVar3 != 1) {
      mlu = matd_plu(x);
      if (mlu->singular == 0) {
        pmVar5 = matd_identity(x->nrows);
        pmVar6 = matd_plu_solve(mlu,pmVar5);
        if (pmVar5 != (matd_t *)0x0) {
          free(pmVar5);
        }
      }
      else {
        pmVar6 = (matd_t *)0x0;
      }
      matd_plu_destroy(mlu);
      return pmVar6;
    }
    mVar1 = x[1];
    if (((double)mVar1 != 0.0) || (NAN((double)mVar1))) {
      pmVar5 = (matd_t *)calloc(1,0x10);
      pmVar5->nrows = 1;
      pmVar5->ncols = 1;
      pmVar5[1] = (matd_t)(1.0 / (double)mVar1);
      return pmVar5;
    }
  }
  return (matd_t *)0x0;
}

Assistant:

matd_t *matd_inverse(const matd_t *x)
{
    matd_t *m = NULL;

    assert(x != NULL);
    assert(x->nrows == x->ncols);

    if (matd_is_scalar(x)) {
        if (x->data[0] == 0)
            return NULL;

        return matd_create_scalar(1.0 / x->data[0]);
    }

    switch(x->nrows) {
        case 1: {
            double det = x->data[0];
            if (det == 0)
                return NULL;

            double invdet = 1.0 / det;

            m = matd_create(x->nrows, x->nrows);
            MATD_EL(m, 0, 0) = 1.0 * invdet;
            return m;
        }

        case 2: {
            double det = x->data[0] * x->data[3] - x->data[1] * x->data[2];
            if (det == 0)
                return NULL;

            double invdet = 1.0 / det;

            m = matd_create(x->nrows, x->nrows);
            MATD_EL(m, 0, 0) = MATD_EL(x, 1, 1) * invdet;
            MATD_EL(m, 0, 1) = - MATD_EL(x, 0, 1) * invdet;
            MATD_EL(m, 1, 0) = - MATD_EL(x, 1, 0) * invdet;
            MATD_EL(m, 1, 1) = MATD_EL(x, 0, 0) * invdet;
            return m;
        }

        default: {
            matd_plu_t *plu = matd_plu(x);

            matd_t *inv = NULL;
            if (!plu->singular) {
                matd_t *ident = matd_identity(x->nrows);
                inv = matd_plu_solve(plu, ident);
                matd_destroy(ident);
            }

            matd_plu_destroy(plu);

            return inv;
        }
    }

    return NULL; // unreachable
}